

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_bytes_vectored<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_2)

{
  assert_error *this_00;
  ulong value;
  
  if (*(long *)(this + 0x18) == 0) {
    if (*(long *)this == 0) {
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"m_data");
    }
    else {
      value = values_1->_M_string_length + values->_M_string_length + values_2->_M_string_length;
      if (value >> 0x20 == 0) {
        basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::add_field((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,tag,length_delimited);
        basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::add_varint((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,value);
        std::__cxx11::string::reserve(*(ulong *)this);
        std::__cxx11::string::append(*(char **)this,(ulong)(values->_M_dataplus)._M_p);
        std::__cxx11::string::append(*(char **)this,(ulong)(values_1->_M_dataplus)._M_p);
        std::__cxx11::string::append(*(char **)this,(ulong)(values_2->_M_dataplus)._M_p);
        return;
      }
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"sum_size <= std::numeric_limits<pbf_length_type>::max()");
    }
  }
  else {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_bytes_vectored(pbf_tag_type tag, Ts&&... values) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        size_t sum_size = 0;
        (void)std::initializer_list<size_t>{sum_size += values.size()...};
        protozero_assert(sum_size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(sum_size));
        buffer_customization<TBuffer>::reserve_additional(m_data, sum_size);
        (void)std::initializer_list<int>{(buffer_customization<TBuffer>::append(m_data, values.data(), values.size()), 0)...};
    }